

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

Var __thiscall Js::InterpreterStackFrame::GetRootObject(InterpreterStackFrame *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  RootObjectBase *pRVar4;
  RootObjectBase *pRVar5;
  
  if ((*(byte *)(*(long *)(this + 0x88) + 0x44) & 8) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x2173,"(!this->GetFunctionBody()->IsJsBuiltInCode())",
                                "!this->GetFunctionBody()->IsJsBuiltInCode()");
    if (!bVar2) goto LAB_00955661;
    *puVar3 = 0;
  }
  pRVar4 = (RootObjectBase *)GetReg<unsigned_int>(this,1);
  pRVar5 = FunctionBody::LoadRootObject(*(FunctionBody **)(this + 0x88));
  if (pRVar4 != pRVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x2175,"(rootObject == this->GetFunctionBody()->LoadRootObject())",
                                "rootObject == this->GetFunctionBody()->LoadRootObject()");
    if (!bVar2) {
LAB_00955661:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return pRVar4;
}

Assistant:

Var InterpreterStackFrame::GetRootObject() const
    {
        Assert(!this->GetFunctionBody()->IsJsBuiltInCode());
        Var rootObject = GetReg(Js::FunctionBody::RootObjectRegSlot);
        Assert(rootObject == this->GetFunctionBody()->LoadRootObject());
        return rootObject;
    }